

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  char *pcVar5;
  FILE *pFVar6;
  char *__format;
  undefined8 uVar7;
  undefined8 uStack_30;
  int op;
  size_t opsz;
  
  iVar2 = nn_socket(1,0x10);
  pFVar6 = _stderr;
  if (iVar2 == -1) {
    puVar4 = (uint *)__errno_location();
    pcVar5 = nn_err_strerror(*puVar4);
    uVar1 = *puVar4;
    __format = "Failed create socket: %s [%d] (%s:%d)\n";
    uVar7 = 0x24;
LAB_001014aa:
    fprintf(pFVar6,__format,pcVar5,(ulong)uVar1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/domain.c"
            ,uVar7);
    nn_err_abort();
  }
  opsz = 4;
  iVar3 = nn_getsockopt(iVar2,0,0xc,&op);
  pFVar6 = _stderr;
  if (iVar3 == 0) {
    if (opsz == 4) {
      if (op == 1) {
        opsz = 4;
        iVar3 = nn_getsockopt(iVar2,0,0xd,&op);
        pFVar6 = _stderr;
        if (iVar3 != 0) {
          puVar4 = (uint *)__errno_location();
          pcVar5 = nn_err_strerror(*puVar4);
          uVar1 = *puVar4;
          uStack_30 = 0x2e;
          goto LAB_001013e0;
        }
        if (opsz == 4) {
          if (op == 0x10) {
            iVar2 = nn_close(iVar2);
            if (iVar2 != 0) {
              puVar4 = (uint *)__errno_location();
              pFVar6 = _stderr;
              uVar1 = *puVar4;
              if ((uVar1 != 9) && (uVar1 != 0x9523dfd)) {
                pcVar5 = nn_err_strerror(uVar1);
                uVar1 = *puVar4;
                __format = "Failed to close socket: %s [%d] (%s:%d)\n";
                uVar7 = 0x32;
                goto LAB_001014aa;
              }
            }
            return 0;
          }
          pcVar5 = "op == NN_PAIR";
          uStack_30 = 0x30;
        }
        else {
          pcVar5 = "opsz == sizeof (op)";
          uStack_30 = 0x2f;
        }
      }
      else {
        pcVar5 = "op == AF_SP";
        uStack_30 = 0x2a;
      }
    }
    else {
      pcVar5 = "opsz == sizeof (op)";
      uStack_30 = 0x29;
    }
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/domain.c"
            ,uStack_30);
  }
  else {
    puVar4 = (uint *)__errno_location();
    pcVar5 = nn_err_strerror(*puVar4);
    uVar1 = *puVar4;
    uStack_30 = 0x28;
LAB_001013e0:
    fprintf(pFVar6,"%s [%d] (%s:%d)\n",pcVar5,(ulong)uVar1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/domain.c"
            ,uStack_30);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int main ()
{
    int rc;
    int s;
    int op;
    size_t opsz;

    s = test_socket (AF_SP, NN_PAIR);

    opsz = sizeof (op);
    rc = nn_getsockopt (s, NN_SOL_SOCKET, NN_DOMAIN, &op, &opsz);
    errno_assert (rc == 0);
    nn_assert (opsz == sizeof (op));
    nn_assert (op == AF_SP);

    opsz = sizeof (op);
    rc = nn_getsockopt (s, NN_SOL_SOCKET, NN_PROTOCOL, &op, &opsz);
    errno_assert (rc == 0);
    nn_assert (opsz == sizeof (op));
    nn_assert (op == NN_PAIR);

    test_close (s);

    return 0;
}